

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O1

REF_STATUS ref_smooth_tri_weighted_ideal(REF_GRID ref_grid,REF_INT node,REF_DBL *ideal_location)

{
  REF_ADJ_ITEM pRVar1;
  REF_DBL *pRVar2;
  uint uVar3;
  REF_STATUS RVar4;
  REF_ADJ in_RAX;
  long lVar5;
  REF_INT tri;
  undefined4 in_register_00000034;
  undefined8 uVar6;
  int iVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  REF_DBL quality;
  REF_DBL tri_ideal [3];
  REF_INT nodes [27];
  double local_e0;
  undefined8 local_d8;
  double local_d0;
  REF_DBL local_c8 [4];
  REF_INT local_a8 [30];
  
  *ideal_location = 0.0;
  ideal_location[1] = 0.0;
  ideal_location[2] = 0.0;
  tri = -1;
  uVar8 = 0xffffffff;
  if (-1 < node) {
    in_RAX = ref_grid->cell[3]->ref_adj;
    uVar8 = 0xffffffff;
    if (node < in_RAX->nnode) {
      in_RAX = (REF_ADJ)in_RAX->first;
      uVar8 = (ulong)(uint)(&in_RAX->nnode)[(uint)node];
    }
  }
  iVar7 = (int)uVar8;
  if (iVar7 != -1) {
    in_RAX = (REF_ADJ)ref_grid->cell[3]->ref_adj->item;
    tri = (&in_RAX->nitem)[(long)iVar7 * 2];
  }
  dVar9 = 0.0;
  uVar6 = CONCAT44(in_register_00000034,node);
  if (iVar7 != -1) {
    local_d8 = CONCAT44(in_register_00000034,node);
    do {
      local_d0 = dVar9;
      uVar3 = ref_smooth_tri_ideal(ref_grid,(REF_INT)local_d8,tri,local_c8);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0x222,"ref_smooth_tri_weighted_ideal",(ulong)uVar3,"tri ideal",in_RAX);
        return uVar3;
      }
      uVar3 = ref_cell_nodes(ref_grid->cell[3],tri,local_a8);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0x223,"ref_smooth_tri_weighted_ideal",(ulong)uVar3,"nodes",in_RAX);
        return uVar3;
      }
      uVar3 = ref_node_tri_quality(ref_grid->node,local_a8,&local_e0);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0x225,"ref_smooth_tri_weighted_ideal",(ulong)uVar3,"tri qual",in_RAX);
        return uVar3;
      }
      dVar9 = ref_grid->adapt->smooth_min_quality;
      if (local_e0 <= dVar9) {
        local_e0 = dVar9;
      }
      lVar5 = 0;
      do {
        ideal_location[lVar5] = local_c8[lVar5] * (1.0 / local_e0) + ideal_location[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      pRVar1 = ref_grid->cell[3]->ref_adj->item;
      iVar7 = pRVar1[(int)uVar8].next;
      uVar8 = (ulong)iVar7;
      if (uVar8 == 0xffffffffffffffff) {
        tri = -1;
      }
      else {
        tri = pRVar1[uVar8].ref;
      }
      dVar9 = local_d0 + 1.0 / local_e0;
      uVar6 = local_d8;
    } while (iVar7 != -1);
  }
  dVar10 = dVar9 * 1e+20;
  if (dVar10 <= -dVar10) {
    dVar10 = -dVar10;
  }
  if (dVar10 <= 1.0) {
    pRVar2 = ref_grid->node->real;
    lVar5 = (long)((int)uVar6 * 0xf);
    printf("normalization = %e at %e %e %e\n",dVar9,pRVar2[lVar5],pRVar2[lVar5 + 1],
           pRVar2[lVar5 + 2]);
    RVar4 = 4;
  }
  else {
    RVar4 = 0;
    lVar5 = 0;
    do {
      ideal_location[lVar5] = ideal_location[lVar5] * (1.0 / dVar9);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
  }
  return RVar4;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_tri_weighted_ideal(REF_GRID ref_grid,
                                                 REF_INT node,
                                                 REF_DBL *ideal_location) {
  REF_INT item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT ixyz;
  REF_DBL tri_ideal[3];
  REF_DBL quality, weight, normalization;

  normalization = 0.0;
  for (ixyz = 0; ixyz < 3; ixyz++) ideal_location[ixyz] = 0.0;

  each_ref_cell_having_node(ref_grid_tri(ref_grid), node, item, cell) {
    RSS(ref_smooth_tri_ideal(ref_grid, node, cell, tri_ideal), "tri ideal");
    RSS(ref_cell_nodes(ref_grid_tri(ref_grid), cell, nodes), "nodes");
    RSS(ref_node_tri_quality(ref_grid_node(ref_grid), nodes, &quality),
        "tri qual");
    quality = MAX(quality, ref_grid_adapt(ref_grid, smooth_min_quality));
    weight = 1.0 / quality;
    normalization += weight;
    for (ixyz = 0; ixyz < 3; ixyz++)
      ideal_location[ixyz] += weight * tri_ideal[ixyz];
  }

  if (ref_math_divisible(1.0, normalization)) {
    for (ixyz = 0; ixyz < 3; ixyz++)
      ideal_location[ixyz] = (1.0 / normalization) * ideal_location[ixyz];
  } else {
    printf("normalization = %e at %e %e %e\n", normalization,
           ref_node_xyz(ref_grid_node(ref_grid), 0, node),
           ref_node_xyz(ref_grid_node(ref_grid), 1, node),
           ref_node_xyz(ref_grid_node(ref_grid), 2, node));
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}